

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O0

bool FIX::double_conversion::DigitGenCounted
               (DiyFp w,int requested_digits,Vector<char> buffer,int *length,int *kappa)

{
  bool bVar1;
  uint32_t number;
  double_conversion *pdVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  char *pcVar11;
  ulong uVar12;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int digit_1;
  uint64_t rest;
  int local_70;
  int digit;
  int divisor_exponent_plus_one;
  uint32_t divisor;
  uint64_t fractionals;
  undefined1 local_58 [4];
  uint32_t integrals;
  DiyFp one;
  uint64_t w_error;
  int *length_local;
  undefined1 auStack_30 [4];
  int requested_digits_local;
  Vector<char> buffer_local;
  DiyFp w_local;
  
  _auStack_30 = (double_conversion *)buffer.start_;
  buffer_local._8_8_ = w.f_;
  buffer_local.start_._0_4_ = buffer.length_;
  iVar4 = DiyFp::e((DiyFp *)&buffer_local.length_);
  bVar1 = false;
  if (-0x3d < iVar4) {
    iVar4 = DiyFp::e((DiyFp *)&buffer_local.length_);
    bVar1 = iVar4 < -0x1f;
  }
  if (!bVar1) {
    __assert_fail("kMinimalTargetExponent <= w.e() && w.e() <= kMaximalTargetExponent",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x1b1,
                  "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                 );
  }
  one.e_ = 1;
  one._12_4_ = 0;
  iVar4 = DiyFp::e((DiyFp *)&buffer_local.length_);
  iVar5 = DiyFp::e((DiyFp *)&buffer_local.length_);
  DiyFp::DiyFp((DiyFp *)local_58,1L << (-(char)iVar4 & 0x3fU),iVar5);
  uVar9 = DiyFp::f((DiyFp *)&buffer_local.length_);
  iVar4 = DiyFp::e((DiyFp *)local_58);
  fractionals._4_4_ = (uint32_t)(uVar9 >> (-(char)iVar4 & 0x3fU));
  uVar9 = DiyFp::f((DiyFp *)&buffer_local.length_);
  uVar10 = DiyFp::f((DiyFp *)local_58);
  number = fractionals._4_4_;
  _divisor_exponent_plus_one = uVar9 & uVar10 - 1;
  iVar4 = DiyFp::e((DiyFp *)local_58);
  BiggestPowerTen(number,iVar4 + 0x40,(uint32_t *)&digit,&local_70);
  *kappa = local_70;
  *length = 0;
  length_local._4_4_ = requested_digits;
  while (0 < *kappa) {
    uVar6 = fractionals._4_4_ / (uint)digit;
    if (9 < (int)uVar6) {
      __assert_fail("digit <= 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x1cd,
                    "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                   );
    }
    pcVar11 = Vector<char>::operator[]((Vector<char> *)auStack_30,*length);
    *pcVar11 = (char)uVar6 + '0';
    *length = *length + 1;
    length_local._4_4_ = length_local._4_4_ + -1;
    fractionals._4_4_ = fractionals._4_4_ % (uint)digit;
    *kappa = *kappa + -1;
    if (length_local._4_4_ == 0) break;
    digit = (uint)digit / 10;
  }
  uVar6 = fractionals._4_4_;
  if (length_local._4_4_ == 0) {
    iVar7 = DiyFp::e((DiyFp *)local_58);
    uVar3 = (uint)buffer_local.start_;
    pdVar2 = _auStack_30;
    iVar5 = (int)_divisor_exponent_plus_one;
    iVar4 = *length;
    uVar12 = (ulong)(uint)digit;
    iVar8 = DiyFp::e((DiyFp *)local_58);
    buffer_00.length_ = iVar4;
    buffer_00.start_ = (char *)(ulong)uVar3;
    buffer_00._12_4_ = 0;
    w_local._15_1_ =
         RoundWeedCounted(pdVar2,buffer_00,(uVar6 << (-(char)iVar7 & 0x3fU)) + iVar5,
                          uVar12 << (-(char)iVar8 & 0x3fU),one._8_8_,(uint64_t)kappa,
                          (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  else {
    iVar4 = DiyFp::e((DiyFp *)local_58);
    uVar12 = _divisor_exponent_plus_one;
    if (iVar4 < -0x3c) {
      __assert_fail("one.e() >= -60",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x1e7,
                    "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                   );
    }
    uVar9 = DiyFp::f((DiyFp *)local_58);
    if (uVar9 <= uVar12) {
      __assert_fail("fractionals < one.f()",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x1e8,
                    "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                   );
    }
    uVar9 = DiyFp::f((DiyFp *)local_58);
    if (0x1999999999999999 < uVar9) {
      __assert_fail("(((static_cast<uint64_t>(0xFFFFFFFF) << 32) + 0xFFFFFFFFu)) / 10 >= one.f()",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x1e9,
                    "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                   );
    }
    while (uVar6 = (uint)buffer_local.start_, pdVar2 = _auStack_30,
          uVar12 = _divisor_exponent_plus_one,
          0 < length_local._4_4_ && (ulong)one._8_8_ < _divisor_exponent_plus_one) {
      uVar12 = _divisor_exponent_plus_one * 10;
      one._8_8_ = one._8_8_ * 10;
      _divisor_exponent_plus_one = uVar12;
      iVar4 = DiyFp::e((DiyFp *)local_58);
      uVar12 = uVar12 >> (-(char)iVar4 & 0x3fU);
      if (9 < (int)uVar12) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x1ef,
                      "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                     );
      }
      pcVar11 = Vector<char>::operator[]((Vector<char> *)auStack_30,*length);
      *pcVar11 = (char)uVar12 + '0';
      *length = *length + 1;
      length_local._4_4_ = length_local._4_4_ + -1;
      uVar9 = DiyFp::f((DiyFp *)local_58);
      _divisor_exponent_plus_one = uVar9 - 1 & _divisor_exponent_plus_one;
      *kappa = *kappa + -1;
    }
    if (length_local._4_4_ == 0) {
      iVar4 = *length;
      uVar9 = DiyFp::f((DiyFp *)local_58);
      buffer_01.length_ = iVar4;
      buffer_01.start_ = (char *)(ulong)uVar6;
      buffer_01._12_4_ = 0;
      w_local._15_1_ =
           RoundWeedCounted(pdVar2,buffer_01,(int)uVar12,uVar9,one._8_8_,(uint64_t)kappa,
                            (int *)CONCAT44(iVar4,in_stack_fffffffffffffee0));
    }
    else {
      w_local._15_1_ = 0;
    }
  }
  return (bool)w_local._15_1_;
}

Assistant:

static bool DigitGenCounted(DiyFp w,
                            int requested_digits,
                            Vector<char> buffer,
                            int* length,
                            int* kappa) {
  ASSERT(kMinimalTargetExponent <= w.e() && w.e() <= kMaximalTargetExponent);
  ASSERT(kMinimalTargetExponent >= -60);
  ASSERT(kMaximalTargetExponent <= -32);
  // w is assumed to have an error less than 1 unit. Whenever w is scaled we
  // also scale its error.
  uint64_t w_error = 1;
  // We cut the input number into two parts: the integral digits and the
  // fractional digits. We don't emit any decimal separator, but adapt kappa
  // instead. Example: instead of writing "1.2" we put "12" into the buffer and
  // increase kappa by 1.
  DiyFp one = DiyFp(static_cast<uint64_t>(1) << -w.e(), w.e());
  // Division by one is a shift.
  uint32_t integrals = static_cast<uint32_t>(w.f() >> -one.e());
  // Modulo by one is an and.
  uint64_t fractionals = w.f() & (one.f() - 1);
  uint32_t divisor;
  int divisor_exponent_plus_one;
  BiggestPowerTen(integrals, DiyFp::kSignificandSize - (-one.e()),
                  &divisor, &divisor_exponent_plus_one);
  *kappa = divisor_exponent_plus_one;
  *length = 0;

  // Loop invariant: buffer = w / 10^kappa  (integer division)
  // The invariant holds for the first iteration: kappa has been initialized
  // with the divisor exponent + 1. And the divisor is the biggest power of ten
  // that is smaller than 'integrals'.
  while (*kappa > 0) {
    int digit = integrals / divisor;
    ASSERT(digit <= 9);
    buffer[*length] = static_cast<char>('0' + digit);
    (*length)++;
    requested_digits--;
    integrals %= divisor;
    (*kappa)--;
    // Note that kappa now equals the exponent of the divisor and that the
    // invariant thus holds again.
    if (requested_digits == 0) break;
    divisor /= 10;
  }

  if (requested_digits == 0) {
    uint64_t rest =
        (static_cast<uint64_t>(integrals) << -one.e()) + fractionals;
    return RoundWeedCounted(buffer, *length, rest,
                            static_cast<uint64_t>(divisor) << -one.e(), w_error,
                            kappa);
  }

  // The integrals have been generated. We are at the point of the decimal
  // separator. In the following loop we simply multiply the remaining digits by
  // 10 and divide by one. We just need to pay attention to multiply associated
  // data (the 'unit'), too.
  // Note that the multiplication by 10 does not overflow, because w.e >= -60
  // and thus one.e >= -60.
  ASSERT(one.e() >= -60);
  ASSERT(fractionals < one.f());
  ASSERT(UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF) / 10 >= one.f());
  while (requested_digits > 0 && fractionals > w_error) {
    fractionals *= 10;
    w_error *= 10;
    // Integer division by one.
    int digit = static_cast<int>(fractionals >> -one.e());
    ASSERT(digit <= 9);
    buffer[*length] = static_cast<char>('0' + digit);
    (*length)++;
    requested_digits--;
    fractionals &= one.f() - 1;  // Modulo by one.
    (*kappa)--;
  }
  if (requested_digits != 0) return false;
  return RoundWeedCounted(buffer, *length, fractionals, one.f(), w_error,
                          kappa);
}